

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O3

double SRCTools::SincResampler::KaizerWindow::bessel(double x)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = x * 0.5;
  dVar4 = dVar3 * dVar3;
  dVar2 = 0.0;
  if (0.0 < dVar4) {
    uVar1 = 2;
    dVar5 = dVar3;
    do {
      dVar2 = dVar2 + dVar4;
      dVar5 = dVar5 * (dVar3 / (double)uVar1);
      dVar4 = dVar5 * dVar5;
      uVar1 = uVar1 + 1;
    } while (dVar2 * 1.11e-16 < dVar4);
    return dVar2 + 1.0;
  }
  return 1.0;
}

Assistant:

double KaizerWindow::bessel(const double x) {
	static const double EPS = 1.11E-16;

	double sum = 0.0;
	double f = 1.0;
	for (unsigned int i = 1;; ++i) {
		f *= (0.5 * x / i);
		double f2 = f * f;
		if (f2 <= sum * EPS) break;
		sum += f2;
	}
	return 1.0 + sum;
}